

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

int uc_check_cpu_x86_load_seg_x86_64(CPUX86State *env,int seg_reg,int sel)

{
  uint uVar1;
  uint mmu_idx;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  
  iVar4 = 0;
  if (((env->cr[0] & 1) != 0) && (uVar3 = (uint)env->eflags, iVar4 = 0, (uVar3 >> 0x11 & 1) == 0)) {
    uVar1 = env->hflags;
    uVar6 = uVar1 & 3;
    if ((sel & 0xfffcU) == 0) {
      if ((seg_reg != 2) || (iVar4 = 0x15, uVar6 != 3 && (short)uVar1 < 0)) {
        iVar4 = 0;
      }
    }
    else {
      lVar5 = 0x148;
      if ((sel & 4U) == 0) {
        lVar5 = 0x178;
      }
      iVar4 = 0x15;
      if ((sel & 0xfff8U) + 7 <= *(uint *)((long)env->regs + lVar5 + 0x10)) {
        mmu_idx = 2;
        if (((uVar1 >> 0x17 & 1) != 0) && (mmu_idx = 0, uVar6 != 3)) {
          mmu_idx = uVar3 >> 0x11 & 2;
        }
        uVar2 = cpu_ldl_mmuidx_ra_x86_64
                          (env,(ulong)(sel & 0xfff8U | 4) + *(long *)((long)env->regs + lVar5 + 8),
                           mmu_idx,0);
        if ((uVar2 >> 0xc & 1) != 0) {
          uVar3 = uVar2 >> 0xd & 3;
          if (seg_reg == 2) {
            if ((uVar2 & 0xa00) != 0x200) {
              return 0x15;
            }
            if ((sel & 3U) != uVar6) {
              return 0x15;
            }
            if (uVar3 != uVar6) {
              return 0x15;
            }
          }
          else {
            if ((uVar2 & 0xa00) == 0x800) {
              return 0x15;
            }
            if (((~uVar2 & 0xc00) != 0) && (uVar3 < (sel & 3U) || uVar3 < uVar6)) {
              return 0x15;
            }
          }
          iVar4 = 0x15;
          if ((short)uVar2 < 0) {
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int uc_check_cpu_x86_load_seg(CPUX86State *env, int seg_reg, int sel)
{
    int selector;
    uint32_t e2;
    int cpl, dpl, rpl;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    if (!(env->cr[0] & CR0_PE_MASK) || (env->eflags & VM_MASK)) {
        return 0;
    } else {
        selector = sel & 0xffff;
        cpl = env->hflags & HF_CPL_MASK;
        if ((selector & 0xfffc) == 0) {
            /* null selector case */
            if (seg_reg == R_SS
#ifdef TARGET_X86_64
                && (!(env->hflags & HF_CS64_MASK) || cpl == 3)
#endif
                ) {
                return UC_ERR_EXCEPTION;
            }
            return 0;
        } else {
            if (selector & 0x4) {
                dt = &env->ldt;
            } else {
                dt = &env->gdt;
            }
            index = selector & ~7;
            if ((index + 7) > dt->limit) {
                return UC_ERR_EXCEPTION;
            }
            ptr = dt->base + index;
            e2 = cpu_ldl_kernel(env, ptr + 4);

            if (!(e2 & DESC_S_MASK)) {
                return UC_ERR_EXCEPTION;
            }
            rpl = selector & 3;
            dpl = (e2 >> DESC_DPL_SHIFT) & 3;
            if (seg_reg == R_SS) {
                /* must be writable segment */
                if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                    return UC_ERR_EXCEPTION;
                }
                if (rpl != cpl || dpl != cpl) {
                    return UC_ERR_EXCEPTION;
                }
            } else {
                /* must be readable segment */
                if ((e2 & (DESC_CS_MASK | DESC_R_MASK)) == DESC_CS_MASK) {
                    return UC_ERR_EXCEPTION;
                }

                if (!(e2 & DESC_CS_MASK) || !(e2 & DESC_C_MASK)) {
                    /* if not conforming code, test rights */
                    if (dpl < cpl || dpl < rpl) {
                        return UC_ERR_EXCEPTION;
                    }
                }
            }

            if (!(e2 & DESC_P_MASK)) {
                if (seg_reg == R_SS) {
                    return UC_ERR_EXCEPTION;
                } else {
                    return UC_ERR_EXCEPTION;
                }
            }
        }
    }

    return 0;
}